

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O2

void co_swap(stCoRoutine_t *curr,stCoRoutine_t *pending_co)

{
  long lVar1;
  stCoRoutine_t *occupy_co;
  long lVar2;
  long in_FS_OFFSET;
  char c;
  char local_11;
  
  lVar1 = *(long *)(in_FS_OFFSET + -0x10);
  curr->stack_sp = &local_11;
  if (pending_co->cIsShareStack == '\0') {
    *(undefined8 *)(lVar1 + 0x410) = 0;
    *(undefined8 *)(lVar1 + 0x418) = 0;
  }
  else {
    *(stCoRoutine_t **)(lVar1 + 0x410) = pending_co;
    occupy_co = pending_co->stack_mem->occupy_co;
    pending_co->stack_mem->occupy_co = pending_co;
    *(stCoRoutine_t **)(lVar1 + 0x418) = occupy_co;
    if (occupy_co != pending_co && occupy_co != (stCoRoutine_t *)0x0) {
      save_stack_buffer(occupy_co);
    }
  }
  coctx_swap(&curr->ctx,&pending_co->ctx);
  lVar1 = *(long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x418);
  if ((((lVar1 != 0) && (lVar2 = *(long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x410), lVar2 != 0)) &&
      (lVar1 != lVar2)) &&
     ((*(void **)(lVar2 + 0xc0) != (void *)0x0 && ((ulong)*(uint *)(lVar2 + 0xb8) != 0)))) {
    memcpy(*(void **)(lVar2 + 0xb0),*(void **)(lVar2 + 0xc0),(ulong)*(uint *)(lVar2 + 0xb8));
  }
  return;
}

Assistant:

void co_swap(stCoRoutine_t* curr, stCoRoutine_t* pending_co)
{
 	stCoRoutineEnv_t* env = co_get_curr_thread_env();

	//get curr stack sp
	char c;
	curr->stack_sp= &c;

	if (!pending_co->cIsShareStack)
	{
		env->pending_co = NULL;
		env->occupy_co = NULL;
	}
	else 
	{
		env->pending_co = pending_co;
		//get last occupy co on the same stack mem
		stCoRoutine_t* occupy_co = pending_co->stack_mem->occupy_co;
		//set pending co to occupy thest stack mem;
		pending_co->stack_mem->occupy_co = pending_co;

		env->occupy_co = occupy_co;
		if (occupy_co && occupy_co != pending_co)
		{
			save_stack_buffer(occupy_co);
		}
	}

	//swap context
	coctx_swap(&(curr->ctx),&(pending_co->ctx) );

	//stack buffer may be overwrite, so get again;
	stCoRoutineEnv_t* curr_env = co_get_curr_thread_env();
	stCoRoutine_t* update_occupy_co =  curr_env->occupy_co;
	stCoRoutine_t* update_pending_co = curr_env->pending_co;
	
	if (update_occupy_co && update_pending_co && update_occupy_co != update_pending_co)
	{
		//resume stack buffer
		if (update_pending_co->save_buffer && update_pending_co->save_size > 0)
		{
			memcpy(update_pending_co->stack_sp, update_pending_co->save_buffer, update_pending_co->save_size);
		}
	}
}